

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

PsbtGlobalXpubStruct * __thiscall
cfd::api::json::PsbtGlobalXpub::ConvertToStruct(PsbtGlobalXpub *this)

{
  long in_RSI;
  PsbtGlobalXpubStruct *in_RDI;
  PsbtGlobalXpubStruct *result;
  XpubDataStruct *pXVar1;
  PsbtGlobalXpubStruct *this_00;
  XpubData *in_stack_ffffffffffffff78;
  PsbtGlobalXpubStruct *in_stack_ffffffffffffffa0;
  
  this_00 = in_RDI;
  PsbtGlobalXpubStruct::PsbtGlobalXpubStruct(in_stack_ffffffffffffffa0);
  XpubData::ConvertToStruct(in_stack_ffffffffffffff78);
  pXVar1 = (XpubDataStruct *)&stack0xffffffffffffff78;
  XpubDataStruct::operator=(&this_00->xpub,pXVar1);
  XpubDataStruct::~XpubDataStruct(&this_00->xpub);
  std::__cxx11::string::operator=((string *)&this_00->master_fingerprint,(string *)(in_RSI + 0xb0));
  std::__cxx11::string::operator=((string *)&this_00->path,(string *)(in_RSI + 0xd0));
  std::__cxx11::string::operator=((string *)&this_00->descriptor_xpub,(string *)(in_RSI + 0xf0));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pXVar1);
  return in_RDI;
}

Assistant:

PsbtGlobalXpubStruct PsbtGlobalXpub::ConvertToStruct() const {  // NOLINT
  PsbtGlobalXpubStruct result;
  result.xpub = xpub_.ConvertToStruct();
  result.master_fingerprint = master_fingerprint_;
  result.path = path_;
  result.descriptor_xpub = descriptor_xpub_;
  result.ignore_items = ignore_items;
  return result;
}